

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffhist2e(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],
            char **colexpr,double *minin,double *maxin,double *binsizein,char (*minname) [71],
            char (*maxname) [71],char (*binname) [71],double weightin,char *wtcol,char *wtexpr,
            int recip,char *selectrow,int *status)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  int *in_R9;
  double in_XMM0_Qa;
  int *in_stack_00000028;
  double *in_stack_00000030;
  char *in_stack_00000038;
  char *in_stack_00000040;
  int in_stack_00000048;
  double *in_stack_00000058;
  double *in_stack_00000060;
  char **in_stack_00000068;
  char (*in_stack_00000070) [71];
  int in_stack_0000007c;
  fitsfile *in_stack_00000080;
  ParseData lParse;
  long naxes [5];
  long nelem;
  int naxis1;
  long vectorRepeat;
  char errmsg [81];
  long wtrepeat;
  long *repeat;
  int wtdatatype;
  int datatypes [4];
  int numIterCols;
  double weight;
  double binsize [4];
  double amax [4];
  double amin [4];
  long haxes [4];
  int wtcolnum;
  int colnum [4];
  int bitpix;
  fitsfile *histptr;
  int *in_stack_000003f8;
  int *in_stack_00000400;
  int in_stack_00000408;
  int in_stack_0000040c;
  fitsfile *in_stack_00000410;
  fitsfile *in_stack_00000418;
  int *in_stack_00000558;
  char *in_stack_00000560;
  fitsfile **in_stack_00000568;
  double in_stack_00000808;
  long *in_stack_00000810;
  int in_stack_00000818;
  int in_stack_0000081c;
  int *in_stack_00000820;
  fitsfile *in_stack_00000828;
  fitsfile *in_stack_00000830;
  int *in_stack_00000850;
  char **in_stack_00000858;
  double *in_stack_00000860;
  double *in_stack_00000868;
  double *in_stack_00000870;
  int in_stack_00000878;
  char *in_stack_00000880;
  int in_stack_00000888;
  char *in_stack_00000890;
  int *in_stack_00000898;
  ParseData *lParse_00;
  fitsfile *pfVar3;
  long *repeat_00;
  PixelFilter **typecode;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long *status_00;
  Node **colnum_00;
  double *templt;
  undefined8 in_stack_fffffffffffffd08;
  fitsfile *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  fitsfile *in_stack_fffffffffffffd28;
  long *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd44;
  char *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd54;
  fitsfile *in_stack_fffffffffffffd58;
  char **in_stack_fffffffffffffd60;
  char (*in_stack_fffffffffffffd68) [71];
  double *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  fitsfile *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffda0;
  ParseData local_1e8;
  fitsfile local_f8 [2];
  fitsfile local_d8 [2];
  fitsfile local_b8 [3];
  long local_88 [2];
  undefined4 local_74;
  long local_70;
  double local_68;
  int *local_60;
  int local_4c;
  long *local_40;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  local_1e8.nDataRows._4_4_ = 0;
  local_1e8.varData._4_4_ = 0;
  local_1e8.nAxes[4] = 0;
  if (0 < *(int *)in_stack_00000058) {
    return *(int *)in_stack_00000058;
  }
  if (in_ECX < 5) {
    local_68 = in_XMM0_Qa;
    local_60 = in_R9;
    local_4c = in_EDX;
    local_40 = in_RDI;
    if (*(int *)*in_RDI != *(int *)(*(long *)(*in_RDI + 8) + 0x54)) {
      ffmahd(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
             in_stack_fffffffffffffd18,&in_stack_fffffffffffffd10->HDUposition);
    }
    if (local_4c == 0xb) {
      local_74 = 8;
    }
    else if (local_4c == 0x15) {
      local_74 = 0x10;
    }
    else if (local_4c == 0x1f) {
      local_74 = 0x20;
    }
    else if (local_4c == 0x2a) {
      local_74 = 0xffffffe0;
    }
    else {
      if (local_4c != 0x52) {
        *(undefined4 *)in_stack_00000058 = 0x19a;
        goto LAB_001f6973;
      }
      local_74 = 0xffffffc0;
    }
    repeat_00 = local_88;
    typecode = &local_1e8.pixFilter;
    pfVar3 = local_b8;
    fptr_00 = local_d8;
    fptr_01 = local_f8;
    status_00 = &local_1e8.nPrevDataRows;
    colnum_00 = &local_1e8.Nodes;
    templt = in_stack_00000058;
    iVar1 = fits_calc_binningde(in_stack_00000080,in_stack_0000007c,in_stack_00000070,
                                in_stack_00000068,in_stack_00000060,in_stack_00000058,
                                (double *)lParse._24_8_,(char (*) [71])lParse._32_8_,
                                (char (*) [71])lParse.expr,(char (*) [71])lParse._48_8_,
                                &(lParse.Nodes)->operation,(int *)lParse._64_8_,
                                (long *)lParse._72_8_,(double *)lParse.firstRow,
                                (double *)lParse.nRows,(double *)lParse._96_8_,
                                (long *)lParse.nElements,(int *)lParse._112_8_);
    if (iVar1 < 1) {
      if (*in_stack_00000038 == '\0') {
        if ((in_stack_00000040 == (char *)0x0) || (*in_stack_00000040 == '\0')) {
          local_1e8.totalRows = (long)local_68;
          local_1e8.nAxes[4] = (long)local_1e8.Nodes;
          local_1e8.varData._4_4_ = 0x52;
        }
        else {
          lParse_00 = &local_1e8;
          in_stack_00000030 = in_stack_00000058;
          ffiprs(in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd44,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                 (int *)in_stack_fffffffffffffd70,
                 (long *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (ParseData *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 &in_stack_fffffffffffffd88->HDUposition);
          ffcprs(lParse_00);
          if ((long)local_1e8.expr < 0) {
            local_1e8.expr = (char *)0x1;
          }
          local_1e8.totalRows = -0x4757c1d7a1454b49;
          local_1e8.nAxes[4] = (long)local_1e8.expr;
        }
      }
      else {
        iVar1 = ffgky(fptr_01,(int)((ulong)fptr_00 >> 0x20),(char *)pfVar3,typecode,
                      (char *)repeat_00,(int *)in_stack_00000030);
        if (iVar1 == 0) {
          local_1e8.varData._4_4_ = 0x52;
          local_1e8.nAxes[4] = 1;
        }
        else {
          *(undefined4 *)in_stack_00000058 = 0;
          iVar2 = ffgcno(in_stack_fffffffffffffd10,iVar2,(char *)templt,(int *)colnum_00,
                         (int *)status_00);
          if (0 < iVar2) {
            ffpmsg((char *)0x1f64d1);
            ffpmsg((char *)0x1f64de);
            goto LAB_001f6973;
          }
          ffeqty(fptr_00,(int)((ulong)pfVar3 >> 0x20),(int *)typecode,repeat_00,
                 (long *)in_stack_00000030,in_stack_00000028);
          local_1e8.totalRows = -0x4757c1d7a1454b49;
        }
      }
      if ((((local_1e8.varData._4_4_ < 0) || (local_1e8.varData._4_4_ == 0x10)) ||
          (local_1e8.varData._4_4_ == 1)) || (local_1e8.varData._4_4_ == 0xe)) {
        ffpmsg((char *)0x1f666a);
        *(undefined4 *)in_stack_00000058 = 0x19a;
      }
      else if ((Node *)local_1e8.nAxes[4] == local_1e8.Nodes) {
        if ((0.0 < (double)local_1e8.totalRows) ||
           (((double)local_1e8.totalRows == -9.1191291391491e-36 &&
            (!NAN((double)local_1e8.totalRows))))) {
          if ((in_stack_00000048 != 0) &&
             (((double)local_1e8.totalRows != -9.1191291391491e-36 ||
              (NAN((double)local_1e8.totalRows))))) {
            local_1e8.totalRows = (long)(1.0 / (double)local_1e8.totalRows);
          }
          iVar2 = ffinit(in_stack_00000568,in_stack_00000560,in_stack_00000558);
          if (iVar2 < 1) {
            iVar2 = ffcrim(pfVar3,(int)((ulong)typecode >> 0x20),(int)typecode,repeat_00,
                           (int *)in_stack_00000030);
            if (iVar2 < 1) {
              iVar2 = fits_copy_pixlist2image
                                (in_stack_00000418,in_stack_00000410,in_stack_0000040c,
                                 in_stack_00000408,in_stack_00000400,in_stack_000003f8);
              if (iVar2 < 1) {
                fits_write_keys_histoe
                          (in_stack_fffffffffffffd88,
                           (fitsfile *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                           ,in_stack_fffffffffffffd7c,(int *)in_stack_fffffffffffffd70,
                           in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                           in_stack_fffffffffffffda0);
                fits_rebin_wcsd(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                                (double *)
                                CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                                in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
                pfVar3 = local_d8;
                iVar2 = fits_make_histde(in_stack_00000830,in_stack_00000828,in_stack_00000820,
                                         in_stack_0000081c,in_stack_00000818,in_stack_00000810,
                                         in_stack_00000850,in_stack_00000858,in_stack_00000860,
                                         in_stack_00000868,in_stack_00000870,in_stack_00000808,
                                         in_stack_00000878,in_stack_00000880,in_stack_00000888,
                                         in_stack_00000890,in_stack_00000898);
                if (iVar2 < 1) {
                  ffclos(pfVar3,local_60);
                  *local_40 = local_70;
                }
                else {
                  ffpmsg((char *)0x1f6946);
                }
              }
              else {
                ffpmsg((char *)0x1f67ee);
              }
            }
            else {
              ffpmsg((char *)0x1f67a4);
            }
          }
          else {
            ffpmsg((char *)0x1f6763);
          }
        }
        else {
          ffpmsg((char *)0x1f66e3);
          *(undefined4 *)in_stack_00000058 = 0x7d;
        }
      }
      else {
        ffpmsg((char *)0x1f669b);
        *(undefined4 *)in_stack_00000058 = 0x140;
      }
    }
    else {
      ffpmsg((char *)0x1f641f);
    }
  }
  else {
    ffpmsg((char *)0x1f622a);
    *(undefined4 *)in_stack_00000058 = 0x140;
  }
LAB_001f6973:
  return *(int *)in_stack_00000058;
}

Assistant:

int ffhist2e(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
	   char *colexpr[4], /* I - optionally, expression intead of colum  */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
	   char *wtexpr,           /* I - optionally, weight expression     */
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;
    int numIterCols = 0;
    int datatypes[4], wtdatatype = 0;
    long *repeat, wtrepeat = 0;
    char errmsg[FLEN_ERRMSG];
    long vectorRepeat;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        *status = BAD_DIMEN;
	goto cleanup;
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else {
        *status = BAD_DATATYPE;
      	goto cleanup;
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningde(
      *fptr, naxis, colname, colexpr, 
      minin, maxin, binsizein, minname, maxname, binname,
      colnum, datatypes, haxes, amin, amax, binsize, 
      &vectorRepeat, status) > 0)
    {
        ffpmsg("failed to determine binning parameters");
      	goto cleanup;
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &weight, NULL, status) == 0)
	{
	  /* Data type if keyword was found */
	  wtdatatype = TDOUBLE;
	  wtrepeat   = 1;
	}
	else
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
	       goto cleanup;
            }

	    /* get the datatype of the column */
	    fits_get_eqcoltype(*fptr, wtcolnum, &wtdatatype,
			       &wtrepeat, NULL, status);

            weight = DOUBLENULLVALUE;
        } 
    }
    else if (wtexpr && wtexpr[0])  /* A weighting expression - always TDOUBLE */
    {     
      /* Initialize the parser so that we can determine the datatype
	 of the returned type as well as the vector dimensions.  The
	 parsers is kept allocated so we can assemble an iterator that
	 uses it below.
      */
      int naxis1;
      long int nelem, naxes[MAXDIMS];
      ParseData lParse;

      ffiprs( *fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &nelem, &naxis1,
	      naxes, &lParse, status );
      ffcprs( &lParse );
      if (nelem < 0) nelem = 1; /* If it's a constant expression */

      weight = DOUBLENULLVALUE;
      wtrepeat = nelem;
      wtdatatype = wtdatatype;

    }
    else
    {
        weight = (double) weightin;
	wtrepeat = vectorRepeat;
	wtdatatype = TDOUBLE;
    }

    /* Make sure weighting column is not an un-binnable data type */
    if (wtdatatype < 0 || wtdatatype == TSTRING || wtdatatype == TBIT || 
	wtdatatype == TLOGICAL) {
      ffpmsg("Invalid datatype for bin weighting factor");
      *status = BAD_DATATYPE;
      goto cleanup;
    }

    /* And dimensions of weighting must agree with input column data */
    if (wtrepeat != vectorRepeat) {
      ffpmsg("Vector dimensions of weighting do not agree with binning columns");
      *status = BAD_DIMEN;
      goto cleanup;
    }      

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = URL_PARSE_ERROR;
	goto cleanup;
    }

    if (recip && weight != DOUBLENULLVALUE) {
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);
    }


    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
	goto cleanup;
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
	goto cleanup;
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS form */
    if (fits_copy_pixlist2image(*fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
	goto cleanup;
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histoe(*fptr, histptr, naxis, colnum, colname, colexpr, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histde(*fptr, histptr, datatypes, bitpix, naxis, haxes, 
			 colnum, colexpr, amin, amax, binsize,
			 weight, wtcolnum, wtexpr, recip, 
			 selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
	goto cleanup;
    }
              
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

 cleanup:
    return(*status);
}